

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::mark_implicit_builtin
          (CompilerMSL *this,StorageClass storage,BuiltIn builtin,uint32_t id)

{
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *this_00;
  SPIREntryPoint *pSVar1;
  TypedID<(spirv_cross::Types)2> *pTVar2;
  TypedID<(spirv_cross::Types)2> *pTVar3;
  TypedID<(spirv_cross::Types)2> local_38;
  TypedID<(spirv_cross::Types)2> local_34;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *local_30;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *var;
  Bitset *active_builtins;
  BuiltIn local_18;
  uint32_t id_local;
  BuiltIn builtin_local;
  StorageClass storage_local;
  CompilerMSL *this_local;
  
  var = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *)0x0;
  if (storage == StorageClassInput) {
    var = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *)
          &(this->super_CompilerGLSL).super_Compiler.active_input_builtins;
  }
  else if (storage == StorageClassOutput) {
    var = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *)
          &(this->super_CompilerGLSL).super_Compiler.active_output_builtins;
  }
  active_builtins._4_4_ = id;
  local_18 = builtin;
  id_local = storage;
  _builtin_local = this;
  if (var == (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *)0x0) {
    __assert_fail("active_builtins != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                  ,0x494,
                  "void spirv_cross::CompilerMSL::mark_implicit_builtin(StorageClass, BuiltIn, uint32_t)"
                 );
  }
  Bitset::set((Bitset *)var,builtin);
  pSVar1 = Compiler::get_entry_point((Compiler *)this);
  local_30 = &pSVar1->interface_variables;
  pTVar2 = ::std::begin<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                     (local_30);
  pTVar3 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                     (local_30);
  TypedID<(spirv_cross::Types)2>::TypedID(&local_34,active_builtins._4_4_);
  pTVar2 = ::std::
           find<spirv_cross::TypedID<(spirv_cross::Types)2>*,spirv_cross::TypedID<(spirv_cross::Types)2>>
                     (pTVar2,pTVar3,&local_34);
  pTVar3 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                     (local_30);
  this_00 = local_30;
  if (pTVar2 == pTVar3) {
    TypedID<(spirv_cross::Types)2>::TypedID(&local_38,active_builtins._4_4_);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::push_back(this_00,&local_38);
  }
  return;
}

Assistant:

void CompilerMSL::mark_implicit_builtin(StorageClass storage, BuiltIn builtin, uint32_t id)
{
	Bitset *active_builtins = nullptr;
	switch (storage)
	{
	case StorageClassInput:
		active_builtins = &active_input_builtins;
		break;

	case StorageClassOutput:
		active_builtins = &active_output_builtins;
		break;

	default:
		break;
	}

	assert(active_builtins != nullptr);
	active_builtins->set(builtin);

	auto &var = get_entry_point().interface_variables;
	if (find(begin(var), end(var), VariableID(id)) == end(var))
		var.push_back(id);
}